

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitTupleMake(PrintExpressionContents *this,TupleMake *curr)

{
  string_view str;
  
  str._M_str = "tuple.make ";
  str._M_len = 0xb;
  printMedium(this->o,str);
  std::ostream::_M_insert<unsigned_long>((ulong)this->o);
  return;
}

Assistant:

void visitTupleMake(TupleMake* curr) {
    printMedium(o, "tuple.make ");
    o << curr->operands.size();
  }